

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_setopt.c
# Opt level: O0

CURLcode libcurl_generate_slist(curl_slist *slist,int *slistno)

{
  char *local_30;
  char *escaped;
  CURLcode ret;
  int *slistno_local;
  curl_slist *slist_local;
  
  local_30 = (char *)0x0;
  easysrc_slist_count = easysrc_slist_count + 1;
  *slistno = easysrc_slist_count;
  escaped._4_4_ = easysrc_addf(&easysrc_decl,"struct curl_slist *slist%d;",(ulong)(uint)*slistno);
  if ((((escaped._4_4_ == CURLE_OK) &&
       (escaped._4_4_ = easysrc_addf(&easysrc_data,"slist%d = NULL;",(ulong)(uint)*slistno),
       escaped._4_4_ == CURLE_OK)) &&
      (escaped._4_4_ =
            easysrc_addf(&easysrc_clean,"curl_slist_free_all(slist%d);",(ulong)(uint)*slistno),
      escaped._4_4_ == CURLE_OK)) &&
     (escaped._4_4_ = easysrc_addf(&easysrc_clean,"slist%d = NULL;",(ulong)(uint)*slistno),
     slistno_local = (int *)slist, escaped._4_4_ == CURLE_OK)) {
    for (; slistno_local != (int *)0x0; slistno_local = *(int **)(slistno_local + 2)) {
      free(local_30);
      local_30 = c_escape(*(char **)slistno_local,-1);
      if (local_30 == (char *)0x0) {
        return CURLE_OUT_OF_MEMORY;
      }
      escaped._4_4_ =
           easysrc_addf(&easysrc_data,"slist%d = curl_slist_append(slist%d, \"%s\");",
                        (ulong)(uint)*slistno,(ulong)(uint)*slistno,local_30);
      if (escaped._4_4_ != CURLE_OK) break;
    }
  }
  free(local_30);
  return escaped._4_4_;
}

Assistant:

static CURLcode libcurl_generate_slist(struct curl_slist *slist, int *slistno)
{
  CURLcode ret = CURLE_OK;
  char *escaped = NULL;

  /* May need several slist variables, so invent name */
  *slistno = ++easysrc_slist_count;

  DECL1("struct curl_slist *slist%d;", *slistno);
  DATA1("slist%d = NULL;", *slistno);
  CLEAN1("curl_slist_free_all(slist%d);", *slistno);
  CLEAN1("slist%d = NULL;", *slistno);
  for(; slist; slist = slist->next) {
    Curl_safefree(escaped);
    escaped = c_escape(slist->data, ZERO_TERMINATED);
    if(!escaped)
      return CURLE_OUT_OF_MEMORY;
    DATA3("slist%d = curl_slist_append(slist%d, \"%s\");",
                                       *slistno, *slistno, escaped);
  }

 nomem:
  Curl_safefree(escaped);
  return ret;
}